

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

RPCHelpMan * estimaterawfee(void)

{
  size_type *psVar1;
  long *plVar2;
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_20;
  string description_21;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  RPCHelpMan *in_RDI;
  long lVar12;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffe828;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffe82c;
  undefined1 in_stack_ffffffffffffe830 [16];
  undefined8 in_stack_ffffffffffffe848;
  undefined8 in_stack_ffffffffffffe850;
  undefined8 in_stack_ffffffffffffe858;
  code *pcVar14;
  undefined8 in_stack_ffffffffffffe860;
  undefined1 in_stack_ffffffffffffe868 [16];
  pointer in_stack_ffffffffffffe878;
  pointer pRVar15;
  pointer in_stack_ffffffffffffe880;
  pointer pRVar16;
  pointer in_stack_ffffffffffffe888;
  pointer pRVar17;
  pointer in_stack_ffffffffffffe890;
  undefined1 in_stack_ffffffffffffe898 [16];
  pointer in_stack_ffffffffffffe8a8;
  undefined8 in_stack_ffffffffffffe8b0;
  pointer in_stack_ffffffffffffe8b8;
  pointer in_stack_ffffffffffffe8c0;
  pointer in_stack_ffffffffffffe8c8;
  undefined1 auVar18 [32];
  undefined1 in_stack_ffffffffffffe8d0 [40];
  pointer in_stack_ffffffffffffe8f8;
  pointer in_stack_ffffffffffffe900;
  pointer in_stack_ffffffffffffe908;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e8;
  allocator_type local_16c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a8;
  allocator_type local_1689;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1688;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1668;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1648;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1628;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1608;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15d0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1598;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1578;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1560;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1548;
  RPCResults local_1530;
  allocator_type local_1511;
  double local_1510;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1508;
  string local_14f0;
  string local_14d0;
  string local_14b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1490;
  size_type local_1488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1480;
  long *local_1470 [2];
  long local_1460 [2];
  long *local_1450 [2];
  long local_1440 [2];
  RPCResult local_1430;
  long *local_13a8 [2];
  long local_1398 [2];
  long *local_1388 [2];
  long local_1378 [2];
  long *local_1368 [2];
  long local_1358 [2];
  long *local_1348 [2];
  long local_1338 [2];
  RPCResult local_1328;
  long *local_12a0 [2];
  long local_1290 [2];
  long *local_1280 [2];
  long local_1270 [2];
  long *local_1260 [2];
  long local_1250 [2];
  long *local_1240 [2];
  long local_1230 [2];
  RPCResult local_1220;
  long *local_1198 [2];
  long local_1188 [2];
  long *local_1178 [2];
  long local_1168 [2];
  long *local_1158 [2];
  long local_1148 [2];
  long *local_1138 [2];
  long local_1128 [2];
  RPCResult local_1118;
  long *local_1090 [2];
  long local_1080 [2];
  long *local_1070 [2];
  long local_1060 [2];
  long *local_1050 [2];
  long local_1040 [2];
  long *local_1030 [2];
  long local_1020 [2];
  long *local_1010 [2];
  long local_1000 [2];
  long *local_ff0 [2];
  long local_fe0 [2];
  long *local_fd0 [2];
  long local_fc0 [2];
  long *local_fb0 [2];
  long local_fa0 [2];
  long *local_f90 [2];
  long local_f80 [2];
  long *local_f70 [2];
  long local_f60 [2];
  long *local_f50 [2];
  long local_f40 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_f30;
  long *local_f10 [2];
  long local_f00 [2];
  pointer local_ef0 [2];
  undefined1 local_ee0 [152];
  RPCResult local_e48;
  RPCResult local_dc0;
  RPCResult local_d38;
  RPCResult local_cb0;
  RPCResult local_c28;
  long *local_ba0 [2];
  long local_b90 [2];
  long *local_b80 [2];
  long local_b70 [2];
  long *local_b60 [2];
  long local_b50 [2];
  long *local_b40 [2];
  long local_b30 [2];
  long *local_b20 [2];
  long local_b10 [2];
  long *local_b00 [2];
  long local_af0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  size_type *local_ac0;
  size_type local_ab8;
  size_type local_ab0 [2];
  long *local_aa0 [2];
  long local_a90 [2];
  RPCResult local_a80;
  RPCResult local_9f8;
  RPCResult local_970;
  RPCResult local_8e8;
  RPCResult local_860;
  undefined1 local_7d8 [136];
  long *local_750 [2];
  long local_740 [2];
  long *local_730 [2];
  long local_720 [2];
  RPCResult local_710;
  RPCResult local_688;
  RPCResult local_600;
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  RPCResult local_538;
  undefined1 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 local_488 [32];
  long *local_468 [2];
  long local_458 [2];
  UniValue local_448;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = (long *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"estimaterawfee","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nWARNING: This interface is unstable and may disappear or change!\n\nWARNING: This is an advanced API call that is tightly coupled to the specific\nimplementation of fee estimation. The parameters it can be called with\nand the results it returns will change if the internal implementation changes.\n\nEstimates the approximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible. Uses virtual transaction size as\ndefined in BIP 141 (witness data is discounted).\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"conf_target","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"Confirmation target in blocks (1 - 1008)","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe828;
  name._8_16_ = in_stack_ffffffffffffe830;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe850;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe848;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe858;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe860;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe868;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe878;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe880;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe888;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe890;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe898;
  description_20._M_string_length = in_stack_ffffffffffffe8b0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe8a8;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe8b8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe8c0;
  auVar18 = in_stack_ffffffffffffe8d0._0_32_;
  opts.oneline_description._M_dataplus._M_p = (pointer)auVar18._0_8_;
  opts.oneline_description._M_string_length = auVar18._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar18._16_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe8d0._32_8_;
  opts._0_8_ = in_stack_ffffffffffffe8c8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe8f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe900;
  opts._64_8_ = in_stack_ffffffffffffe908;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_20,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"threshold","");
  local_1510 = 0.95;
  UniValue::UniValue<double,_double,_true>(&local_448,&local_1510);
  paVar11 = &local_448.val.field_2;
  local_3f0._8_8_ = (long)&local_3f0 + 0x18;
  local_3f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_448.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p == paVar11) {
    local_3f0._32_8_ = local_448.val.field_2._8_8_;
  }
  else {
    local_3f0._8_8_ = local_448.val._M_dataplus._M_p;
  }
  local_3f0._16_8_ = local_448.val._M_string_length;
  local_448.val._M_string_length = 0;
  local_448.val.field_2._M_local_buf[0] = '\0';
  local_3f0._40_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f0._48_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0._56_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._64_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3f0._68_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3f0._72_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3f0._76_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3f0._80_8_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 2;
  local_468[0] = local_458;
  local_448.val._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,
             "The proportion of transactions in a given feerate range that must have been\nconfirmed within conf_target in order to consider those feerates as high enough and proceed to check\nlower buckets."
             ,"");
  local_4a8 = &local_498;
  local_4b0 = 0;
  local_4a0 = 0;
  local_498 = 0;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_2_ = 0;
  local_488._10_6_ = 0;
  local_488._16_2_ = 0;
  local_488._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe828;
  name_00._8_16_ = in_stack_ffffffffffffe830;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe850;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe848;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe858;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe860;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe868;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe878;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe880;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe888;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe890;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe898;
  description_21._M_string_length = in_stack_ffffffffffffe8b0;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe8a8;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe8b8;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe8c0;
  auVar18 = in_stack_ffffffffffffe8d0._0_32_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar18._0_8_;
  opts_00.oneline_description._M_string_length = auVar18._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar18._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe8d0._32_8_;
  opts_00._0_8_ = in_stack_ffffffffffffe8c8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe8f8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe900;
  opts_00._64_8_ = in_stack_ffffffffffffe908;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_21,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1508,__l,&local_1511);
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"");
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_578,
             "Results are returned for any horizon which tracks blocks up to the confirmation target"
             ,"");
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"short","");
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_750,"estimate for short time horizon","");
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"feerate","");
  std::operator+(&local_ae0,"estimate fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_ae0,"/kvB");
  local_ac0 = local_ab0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_ab0[0] = paVar11->_M_allocated_capacity;
    local_ab0[1] = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_ab0[0] = paVar11->_M_allocated_capacity;
    local_ac0 = psVar1;
  }
  local_ab8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = 0;
  auVar18._4_16_ = in_stack_ffffffffffffe830;
  auVar18._0_4_ = in_stack_ffffffffffffe82c;
  auVar18._20_8_ = in_RDI;
  auVar18._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffe850;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe878;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_a80,NUM,(string)(auVar18 << 0x20),SUB81(local_aa0,0),description,inner,true);
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"decay","");
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b20,
             "exponential decay (per block) for historical moving average of confirmation data","");
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name._8_16_ = in_stack_ffffffffffffe830;
  m_key_name.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffe850;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_9f8,NUM,m_key_name,description_00,inner_00,false);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"scale","");
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,"The resolution of confirmation targets at this time horizon","");
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffe850;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_970,NUM,m_key_name_00,description_01,inner_01,SUB81(local_b40,0));
  local_b80[0] = local_b70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b80,"pass","");
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba0,
             "information about the lowest range of feerates to succeed in meeting the threshold",""
            );
  local_ef0[0] = (pointer)local_ee0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ef0,"startrange","");
  local_f10[0] = local_f00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f10,"start of feerate range","");
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffe850;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_ee0 + 0x10),NUM,m_key_name_01,description_02,inner_02,
             SUB81(local_ef0,0));
  local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f30,"endrange","");
  local_f50[0] = local_f40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f50,"end of feerate range","");
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1608.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffe850;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_e48,NUM,m_key_name_02,description_03,inner_03,SUB81(&local_f30,0));
  local_f70[0] = local_f60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f70,"withintarget","");
  local_f90[0] = local_f80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f90,
             "number of txs over history horizon in the feerate range that were confirmed within target"
             ,"");
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_04._M_string_length = in_stack_ffffffffffffe850;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_dc0,NUM,m_key_name_03,description_04,inner_04,SUB81(local_f70,0));
  local_fb0[0] = local_fa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb0,"totalconfirmed","");
  local_fd0[0] = local_fc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fd0,
             "number of txs over history horizon in the feerate range that were confirmed at any point"
             ,"");
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffe850;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_d38,NUM,m_key_name_04,description_05,inner_05,SUB81(local_fb0,0));
  local_ff0[0] = local_fe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"inmempool","");
  local_1010[0] = local_1000;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1010,
             "current number of txs in mempool in the feerate range unconfirmed for at least target blocks"
             ,"");
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_06._M_string_length = in_stack_ffffffffffffe850;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_cb0,NUM,m_key_name_05,description_06,inner_06,SUB81(local_ff0,0));
  local_1030[0] = local_1020;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1030,"leftmempool","");
  local_1050[0] = local_1040;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1050,
             "number of txs over history horizon in the feerate range that left mempool unconfirmed after target"
             ,"");
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffe850;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_c28,NUM,m_key_name_06,description_07,inner_07,SUB81(local_1030,0));
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)(local_ee0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_15d0,__l_00,&local_1689);
  uVar13 = 0;
  auVar3._4_16_ = in_stack_ffffffffffffe830;
  auVar3._0_4_ = in_stack_ffffffffffffe82c;
  auVar3._20_8_ = in_RDI;
  auVar3._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe850;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_8e8,OBJ,(string)(auVar3 << 0x20),SUB81(local_b80,0),description_08,inner_08,true
            );
  local_1070[0] = local_1060;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1070,"fail","");
  local_1090[0] = local_1080;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1090,
             "information about the highest range of feerates to fail to meet the threshold","");
  local_1138[0] = local_1128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1138,"");
  local_1158[0] = local_1148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1158,"");
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffe850;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_1118,ELISION,m_key_name_07,description_09,inner_09,SUB81(local_1138,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1118;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_16a8,__l_01,&local_16c9);
  uVar13 = 0;
  auVar4._4_16_ = in_stack_ffffffffffffe830;
  auVar4._0_4_ = in_stack_ffffffffffffe82c;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe850;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_860,OBJ,(string)(auVar4 << 0x20),SUB81(local_1070,0),description_10,inner_10,
             true);
  local_1178[0] = local_1168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"errors","");
  local_1198[0] = local_1188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1198,"Errors encountered during processing (if there are any)","");
  local_1240[0] = local_1230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1240,"error","");
  local_1260[0] = local_1250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1260,"");
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_08._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_08.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffe850;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_1220,STR,m_key_name_08,description_11,inner_11,SUB81(local_1240,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_1220;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_16e8,__l_02,(allocator_type *)&stack0xffffffffffffe8f7);
  auVar5._4_16_ = in_stack_ffffffffffffe830;
  auVar5._0_4_ = in_stack_ffffffffffffe82c;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe850;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)local_7d8,ARR,(string)(auVar5 << 0x20),SUB81(local_1178,0),description_12,
             inner_12,true);
  __l_03._M_len = 6;
  __l_03._M_array = &local_a80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1560,__l_03,(allocator_type *)&stack0xffffffffffffe8f6);
  uVar13 = 0;
  auVar6._4_16_ = in_stack_ffffffffffffe830;
  auVar6._0_4_ = in_stack_ffffffffffffe82c;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffe850;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_710,OBJ,(string)(auVar6 << 0x20),SUB81(local_730,0),description_13,inner_13,true
            );
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1280,"medium","");
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a0,"estimate for medium time horizon","");
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,"");
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"");
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_09._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_09.field_2._8_8_ = in_RDI;
  description_14._M_string_length = in_stack_ffffffffffffe850;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_1328,ELISION,m_key_name_09,description_14,inner_14,SUB81(local_1348,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_1328;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8d8,__l_04,
             (allocator_type *)&stack0xffffffffffffe8b7);
  uVar13 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffe830;
  auVar7._0_4_ = in_stack_ffffffffffffe82c;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe850;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe878;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_688,OBJ,(string)(auVar7 << 0x20),SUB81(local_1280,0),description_15,inner_15,
             true);
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,"long","");
  local_13a8[0] = local_1398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a8,"estimate for long time horizon","");
  local_1450[0] = local_1440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1450,"");
  local_1470[0] = local_1460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1470,"");
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_10._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_10.field_2._8_8_ = in_RDI;
  description_16._M_string_length = in_stack_ffffffffffffe850;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_1430,ELISION,m_key_name_10,description_16,inner_16,SUB81(local_1450,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1430;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe898,__l_05,
             (allocator_type *)&stack0xffffffffffffe877);
  uVar13 = 0;
  auVar8._4_16_ = in_stack_ffffffffffffe830;
  auVar8._0_4_ = in_stack_ffffffffffffe82c;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffe850;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar15;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult
            (&local_600,OBJ,(string)(auVar8 << 0x20),SUB81(local_1388,0),description_17,inner_17,
             true);
  __l_06._M_len = 3;
  __l_06._M_array = &local_710;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1548,__l_06,(allocator_type *)&stack0xffffffffffffe876);
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe82c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar13;
  m_key_name_11._8_16_ = in_stack_ffffffffffffe830;
  m_key_name_11.field_2._8_8_ = in_RDI;
  description_18._M_string_length = in_stack_ffffffffffffe850;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe848;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe860;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar15;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe868._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe868._8_8_;
  RPCResult::RPCResult(&local_538,OBJ,m_key_name_11,description_18,inner_18,SUB81(local_558,0));
  result._4_4_ = in_stack_ffffffffffffe82c;
  result.m_type = uVar13;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe830._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe830._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe848;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe850;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe858;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe860;
  result.m_optional = (bool)in_stack_ffffffffffffe868[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe868[1];
  result._66_6_ = in_stack_ffffffffffffe868._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868._8_8_;
  result.m_description._M_string_length = (size_type)pRVar15;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar16;
  result.m_description.field_2._8_8_ = pRVar17;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe890;
  result.m_cond._8_16_ = in_stack_ffffffffffffe898;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffe8a8;
  RPCResults::RPCResults(&local_1530,result);
  local_14d0._M_dataplus._M_p = (pointer)&local_14d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14d0,"estimaterawfee","");
  local_14f0._M_dataplus._M_p = (pointer)&local_14f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14f0,"6 0.9","");
  HelpExampleCli(&local_14b0,&local_14d0,&local_14f0);
  paVar11 = &local_14b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0._M_dataplus._M_p == paVar11) {
    local_1480._8_8_ = local_14b0.field_2._8_8_;
    local_1490 = &local_1480;
  }
  else {
    local_1490 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_14b0._M_dataplus._M_p;
  }
  local_1480._M_allocated_capacity._1_7_ = local_14b0.field_2._M_allocated_capacity._1_7_;
  local_1480._M_local_buf[0] = local_14b0.field_2._M_local_buf[0];
  local_1488 = local_14b0._M_string_length;
  local_14b0._M_string_length = 0;
  local_14b0.field_2._M_local_buf[0] = '\0';
  pcVar14 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:151:9)>
            ::_M_manager;
  name_01._8_16_ = in_stack_ffffffffffffe830;
  name_01._M_dataplus._M_p = &stack0xffffffffffffe848;
  name_01.field_2._8_8_ = in_RDI;
  description_19.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:151:9)>
       ::_M_manager;
  description_19._M_dataplus._M_p = (pointer)0x0;
  description_19._M_string_length = 0;
  description_19.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:151:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe868._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe868._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe890;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe8a8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe898._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe898._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe8b0;
  local_14b0._M_dataplus._M_p = (pointer)paVar11;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_01,description_19,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar14 != (code *)0x0) {
    (*pcVar14)(&stack0xffffffffffffe848,&stack0xffffffffffffe848,3);
  }
  if (local_1490 != &local_1480) {
    operator_delete(local_1490,local_1480._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0._M_dataplus._M_p != paVar11) {
    operator_delete(local_14b0._M_dataplus._M_p,
                    CONCAT71(local_14b0.field_2._M_allocated_capacity._1_7_,
                             local_14b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
    operator_delete(local_14f0._M_dataplus._M_p,local_14f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d0._M_dataplus._M_p != &local_14d0.field_2) {
    operator_delete(local_14d0._M_dataplus._M_p,local_14d0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1530.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_cond._M_dataplus._M_p != &local_538.m_cond.field_2) {
    operator_delete(local_538.m_cond._M_dataplus._M_p,
                    local_538.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_description._M_dataplus._M_p != &local_538.m_description.field_2) {
    operator_delete(local_538.m_description._M_dataplus._M_p,
                    local_538.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_538.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.m_key_name._M_dataplus._M_p != &local_538.m_key_name.field_2) {
    operator_delete(local_538.m_key_name._M_dataplus._M_p,
                    local_538.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1548);
  lVar12 = 0x198;
  do {
    if ((long *)((long)local_720 + lVar12) != *(long **)((long)local_730 + lVar12)) {
      operator_delete(*(long **)((long)local_730 + lVar12),*(long *)((long)local_720 + lVar12) + 1);
    }
    if ((long *)((long)local_740 + lVar12) != *(long **)((long)local_750 + lVar12)) {
      operator_delete(*(long **)((long)local_750 + lVar12),*(long *)((long)local_740 + lVar12) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_7d8 + lVar12 + 0x68));
    if ((long *)(local_7d8 + lVar12 + 0x58) != *(long **)(local_7d8 + lVar12 + 0x48)) {
      operator_delete(*(long **)(local_7d8 + lVar12 + 0x48),*(long *)(local_7d8 + lVar12 + 0x58) + 1
                     );
    }
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe898);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1430.m_cond._M_dataplus._M_p != &local_1430.m_cond.field_2) {
    operator_delete(local_1430.m_cond._M_dataplus._M_p,
                    local_1430.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1430.m_description._M_dataplus._M_p != &local_1430.m_description.field_2) {
    operator_delete(local_1430.m_description._M_dataplus._M_p,
                    local_1430.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1430.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1430.m_key_name._M_dataplus._M_p != &local_1430.m_key_name.field_2) {
    operator_delete(local_1430.m_key_name._M_dataplus._M_p,
                    local_1430.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe878);
  if (local_1470[0] != local_1460) {
    operator_delete(local_1470[0],local_1460[0] + 1);
  }
  if (local_1450[0] != local_1440) {
    operator_delete(local_1450[0],local_1440[0] + 1);
  }
  if (local_13a8[0] != local_1398) {
    operator_delete(local_13a8[0],local_1398[0] + 1);
  }
  if (local_1388[0] != local_1378) {
    operator_delete(local_1388[0],local_1378[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328.m_cond._M_dataplus._M_p != &local_1328.m_cond.field_2) {
    operator_delete(local_1328.m_cond._M_dataplus._M_p,
                    local_1328.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328.m_description._M_dataplus._M_p != &local_1328.m_description.field_2) {
    operator_delete(local_1328.m_description._M_dataplus._M_p,
                    local_1328.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1328.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328.m_key_name._M_dataplus._M_p != &local_1328.m_key_name.field_2) {
    operator_delete(local_1328.m_key_name._M_dataplus._M_p,
                    local_1328.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8b8);
  if (local_1368[0] != local_1358) {
    operator_delete(local_1368[0],local_1358[0] + 1);
  }
  if (local_1348[0] != local_1338) {
    operator_delete(local_1348[0],local_1338[0] + 1);
  }
  if (local_12a0[0] != local_1290) {
    operator_delete(local_12a0[0],local_1290[0] + 1);
  }
  if (local_1280[0] != local_1270) {
    operator_delete(local_1280[0],local_1270[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1560);
  lVar12 = 0x330;
  do {
    if ((long *)((long)local_a90 + lVar12) != *(long **)((long)local_aa0 + lVar12)) {
      operator_delete(*(long **)((long)local_aa0 + lVar12),*(long *)((long)local_a90 + lVar12) + 1);
    }
    if ((long *)((long)local_ab0 + lVar12) != *(long **)((long)&local_ac0 + lVar12)) {
      operator_delete(*(long **)((long)&local_ac0 + lVar12),*(long *)((long)local_ab0 + lVar12) + 1)
      ;
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_ae0._M_dataplus._M_p + lVar12));
    if ((long *)((long)local_af0 + lVar12) != *(long **)((long)local_b00 + lVar12)) {
      operator_delete(*(long **)((long)local_b00 + lVar12),*(long *)((long)local_af0 + lVar12) + 1);
    }
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1220.m_cond._M_dataplus._M_p != &local_1220.m_cond.field_2) {
    operator_delete(local_1220.m_cond._M_dataplus._M_p,
                    local_1220.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1220.m_description._M_dataplus._M_p != &local_1220.m_description.field_2) {
    operator_delete(local_1220.m_description._M_dataplus._M_p,
                    local_1220.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1220.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1220.m_key_name._M_dataplus._M_p != &local_1220.m_key_name.field_2) {
    operator_delete(local_1220.m_key_name._M_dataplus._M_p,
                    local_1220.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8f8);
  if (local_1260[0] != local_1250) {
    operator_delete(local_1260[0],local_1250[0] + 1);
  }
  if (local_1240[0] != local_1230) {
    operator_delete(local_1240[0],local_1230[0] + 1);
  }
  if (local_1198[0] != local_1188) {
    operator_delete(local_1198[0],local_1188[0] + 1);
  }
  if (local_1178[0] != local_1168) {
    operator_delete(local_1178[0],local_1168[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118.m_cond._M_dataplus._M_p != &local_1118.m_cond.field_2) {
    operator_delete(local_1118.m_cond._M_dataplus._M_p,
                    local_1118.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118.m_description._M_dataplus._M_p != &local_1118.m_description.field_2) {
    operator_delete(local_1118.m_description._M_dataplus._M_p,
                    local_1118.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1118.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118.m_key_name._M_dataplus._M_p != &local_1118.m_key_name.field_2) {
    operator_delete(local_1118.m_key_name._M_dataplus._M_p,
                    local_1118.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c8);
  if (local_1158[0] != local_1148) {
    operator_delete(local_1158[0],local_1148[0] + 1);
  }
  if (local_1138[0] != local_1128) {
    operator_delete(local_1138[0],local_1128[0] + 1);
  }
  if (local_1090[0] != local_1080) {
    operator_delete(local_1090[0],local_1080[0] + 1);
  }
  if (local_1070[0] != local_1060) {
    operator_delete(local_1070[0],local_1060[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15d0);
  lVar12 = 0x330;
  do {
    if ((long *)(local_ee0 + lVar12) != *(long **)((long)local_ef0 + lVar12)) {
      operator_delete(*(long **)((long)local_ef0 + lVar12),*(long *)(local_ee0 + lVar12) + 1);
    }
    if ((long *)((long)local_f00 + lVar12) != *(long **)((long)local_f10 + lVar12)) {
      operator_delete(*(long **)((long)local_f10 + lVar12),*(long *)((long)local_f00 + lVar12) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar12));
    if ((long *)((long)local_f40 + lVar12) != *(long **)((long)local_f50 + lVar12)) {
      operator_delete(*(long **)((long)local_f50 + lVar12),*(long *)((long)local_f40 + lVar12) + 1);
    }
    lVar12 = lVar12 + -0x88;
  } while (lVar12 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1688);
  if (local_1050[0] != local_1040) {
    operator_delete(local_1050[0],local_1040[0] + 1);
  }
  if (local_1030[0] != local_1020) {
    operator_delete(local_1030[0],local_1020[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1668);
  if (local_1010[0] != local_1000) {
    operator_delete(local_1010[0],local_1000[0] + 1);
  }
  if (local_ff0[0] != local_fe0) {
    operator_delete(local_ff0[0],local_fe0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1648);
  if (local_fd0[0] != local_fc0) {
    operator_delete(local_fd0[0],local_fc0[0] + 1);
  }
  if (local_fb0[0] != local_fa0) {
    operator_delete(local_fb0[0],local_fa0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1628);
  if (local_f90[0] != local_f80) {
    operator_delete(local_f90[0],local_f80[0] + 1);
  }
  if (local_f70[0] != local_f60) {
    operator_delete(local_f70[0],local_f60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1608);
  if (local_f50[0] != local_f40) {
    operator_delete(local_f50[0],local_f40[0] + 1);
  }
  if (local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_f30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_f30.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15e8);
  if (local_f10[0] != local_f00) {
    operator_delete(local_f10[0],local_f00[0] + 1);
  }
  if (local_ef0[0] != (pointer)local_ee0) {
    operator_delete(local_ef0[0],local_ee0._0_8_ + 1);
  }
  if (local_ba0[0] != local_b90) {
    operator_delete(local_ba0[0],local_b90[0] + 1);
  }
  if (local_b80[0] != local_b70) {
    operator_delete(local_b80[0],local_b70[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15b8);
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0],local_b30[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1598);
  if (local_b20[0] != local_b10) {
    operator_delete(local_b20[0],local_b10[0] + 1);
  }
  if (local_b00[0] != local_af0) {
    operator_delete(local_b00[0],local_af0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1578);
  if (local_ac0 != local_ab0) {
    operator_delete(local_ac0,local_ab0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
  }
  if (local_aa0[0] != local_a90) {
    operator_delete(local_aa0[0],local_a90[0] + 1);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],local_720[0] + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1508);
  lVar12 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar12));
    plVar2 = *(long **)((long)&local_308 + lVar12 + 0x40);
    plVar10 = (long *)((long)&local_308 + lVar12 + 0x50);
    if (plVar10 != plVar2) {
      operator_delete(plVar2,*plVar10 + 1);
    }
    plVar10 = (long *)((long)&local_308 + lVar12 + 0x28);
    plVar2 = *(long **)((long)&local_308 + lVar12 + 0x18);
    if (plVar10 != plVar2) {
      operator_delete(plVar2,*plVar10 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar12));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar12));
    if ((long *)((long)local_380 + lVar12) != *(long **)((long)local_390 + lVar12)) {
      operator_delete(*(long **)((long)local_390 + lVar12),*(long *)((long)local_380 + lVar12) + 1);
    }
    lVar12 = lVar12 + -0x108;
  } while (lVar12 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_448.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p != &local_448.val.field_2) {
    operator_delete(local_448.val._M_dataplus._M_p,
                    CONCAT71(local_448.val.field_2._M_allocated_capacity._1_7_,
                             local_448.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan estimaterawfee()
{
    return RPCHelpMan{"estimaterawfee",
        "\nWARNING: This interface is unstable and may disappear or change!\n"
        "\nWARNING: This is an advanced API call that is tightly coupled to the specific\n"
        "implementation of fee estimation. The parameters it can be called with\n"
        "and the results it returns will change if the internal implementation changes.\n"
        "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\n"
        "confirmation within conf_target blocks if possible. Uses virtual transaction size as\n"
        "defined in BIP 141 (witness data is discounted).\n",
        {
            {"conf_target", RPCArg::Type::NUM, RPCArg::Optional::NO, "Confirmation target in blocks (1 - 1008)"},
            {"threshold", RPCArg::Type::NUM, RPCArg::Default{0.95}, "The proportion of transactions in a given feerate range that must have been\n"
            "confirmed within conf_target in order to consider those feerates as high enough and proceed to check\n"
            "lower buckets."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "Results are returned for any horizon which tracks blocks up to the confirmation target",
            {
                {RPCResult::Type::OBJ, "short", /*optional=*/true, "estimate for short time horizon",
                    {
                        {RPCResult::Type::NUM, "feerate", /*optional=*/true, "estimate fee rate in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::NUM, "decay", "exponential decay (per block) for historical moving average of confirmation data"},
                        {RPCResult::Type::NUM, "scale", "The resolution of confirmation targets at this time horizon"},
                        {RPCResult::Type::OBJ, "pass", /*optional=*/true, "information about the lowest range of feerates to succeed in meeting the threshold",
                        {
                                {RPCResult::Type::NUM, "startrange", "start of feerate range"},
                                {RPCResult::Type::NUM, "endrange", "end of feerate range"},
                                {RPCResult::Type::NUM, "withintarget", "number of txs over history horizon in the feerate range that were confirmed within target"},
                                {RPCResult::Type::NUM, "totalconfirmed", "number of txs over history horizon in the feerate range that were confirmed at any point"},
                                {RPCResult::Type::NUM, "inmempool", "current number of txs in mempool in the feerate range unconfirmed for at least target blocks"},
                                {RPCResult::Type::NUM, "leftmempool", "number of txs over history horizon in the feerate range that left mempool unconfirmed after target"},
                        }},
                        {RPCResult::Type::OBJ, "fail", /*optional=*/true, "information about the highest range of feerates to fail to meet the threshold",
                        {
                            {RPCResult::Type::ELISION, "", ""},
                        }},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Errors encountered during processing (if there are any)",
                        {
                            {RPCResult::Type::STR, "error", ""},
                        }},
                }},
                {RPCResult::Type::OBJ, "medium", /*optional=*/true, "estimate for medium time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
                {RPCResult::Type::OBJ, "long", /*optional=*/true, "estimate for long time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
            }},
        RPCExamples{
            HelpExampleCli("estimaterawfee", "6 0.9")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            CBlockPolicyEstimator& fee_estimator = EnsureAnyFeeEstimator(request.context);
            const NodeContext& node = EnsureAnyNodeContext(request.context);

            CHECK_NONFATAL(node.validation_signals)->SyncWithValidationInterfaceQueue();
            unsigned int max_target = fee_estimator.HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
            unsigned int conf_target = ParseConfirmTarget(request.params[0], max_target);
            double threshold = 0.95;
            if (!request.params[1].isNull()) {
                threshold = request.params[1].get_real();
            }
            if (threshold < 0 || threshold > 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid threshold");
            }

            UniValue result(UniValue::VOBJ);

            for (const FeeEstimateHorizon horizon : ALL_FEE_ESTIMATE_HORIZONS) {
                CFeeRate feeRate;
                EstimationResult buckets;

                // Only output results for horizons which track the target
                if (conf_target > fee_estimator.HighestTargetTracked(horizon)) continue;

                feeRate = fee_estimator.estimateRawFee(conf_target, threshold, horizon, &buckets);
                UniValue horizon_result(UniValue::VOBJ);
                UniValue errors(UniValue::VARR);
                UniValue passbucket(UniValue::VOBJ);
                passbucket.pushKV("startrange", round(buckets.pass.start));
                passbucket.pushKV("endrange", round(buckets.pass.end));
                passbucket.pushKV("withintarget", round(buckets.pass.withinTarget * 100.0) / 100.0);
                passbucket.pushKV("totalconfirmed", round(buckets.pass.totalConfirmed * 100.0) / 100.0);
                passbucket.pushKV("inmempool", round(buckets.pass.inMempool * 100.0) / 100.0);
                passbucket.pushKV("leftmempool", round(buckets.pass.leftMempool * 100.0) / 100.0);
                UniValue failbucket(UniValue::VOBJ);
                failbucket.pushKV("startrange", round(buckets.fail.start));
                failbucket.pushKV("endrange", round(buckets.fail.end));
                failbucket.pushKV("withintarget", round(buckets.fail.withinTarget * 100.0) / 100.0);
                failbucket.pushKV("totalconfirmed", round(buckets.fail.totalConfirmed * 100.0) / 100.0);
                failbucket.pushKV("inmempool", round(buckets.fail.inMempool * 100.0) / 100.0);
                failbucket.pushKV("leftmempool", round(buckets.fail.leftMempool * 100.0) / 100.0);

                // CFeeRate(0) is used to indicate error as a return value from estimateRawFee
                if (feeRate != CFeeRate(0)) {
                    horizon_result.pushKV("feerate", ValueFromAmount(feeRate.GetFeePerK()));
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("pass", std::move(passbucket));
                    // buckets.fail.start == -1 indicates that all buckets passed, there is no fail bucket to output
                    if (buckets.fail.start != -1) horizon_result.pushKV("fail", std::move(failbucket));
                } else {
                    // Output only information that is still meaningful in the event of error
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("fail", std::move(failbucket));
                    errors.push_back("Insufficient data or no feerate found which meets threshold");
                    horizon_result.pushKV("errors", std::move(errors));
                }
                result.pushKV(StringForFeeEstimateHorizon(horizon), std::move(horizon_result));
            }
            return result;
        },
    };
}